

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

ParsingResult * __thiscall
QLocaleData::validateChars
          (ParsingResult *__return_storage_ptr__,QLocaleData *this,QStringView str,
          NumberMode numMode,int decDigits,NumberOptions number_options)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  State SVar4;
  long lVar5;
  uint uVar6;
  QStringView *pQVar7;
  QStringView *pQVar8;
  QArrayData *pQVar9;
  uint uVar10;
  char cVar11;
  long in_FS_OFFSET;
  bool bVar12;
  byte bVar13;
  char c;
  byte local_2e9;
  NumericData local_2e8;
  NumericTokenizer local_230;
  State local_158 [2];
  QVarLengthArray<char,_256LL> local_150;
  long local_38;
  
  lVar5 = str.m_size;
  bVar13 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_158,0xaa,0x120);
  local_158[0] = Invalid;
  local_150.super_QVLABase<char>.super_QVLABaseBase.a = 0x100;
  local_150.super_QVLABase<char>.super_QVLABaseBase.s = 0;
  local_150.super_QVLABase<char>.super_QVLABaseBase.ptr =
       &local_150.super_QVLAStorage<1UL,_1UL,_256LL>;
  if (0x100 < lVar5) {
    QVLABase<char>::reallocate_impl
              (&local_150.super_QVLABase<char>,0x100,&local_150.super_QVLAStorage<1UL,_1UL,_256LL>,0
               ,lVar5);
  }
  memset(&local_230.m_guide.sysGroup,0xaa,0xb0);
  numericData(&local_2e8,this,numMode);
  local_230.m_text.m_size = lVar5;
  local_230.m_text.m_data = str.m_data;
  local_230.m_guide.sysDecimal.d.d =
       (Data *)CONCAT71(local_2e8.sysDecimal.d.d._1_7_,(byte)local_2e8.sysDecimal.d.d);
  local_230.m_guide.sysDecimal.d.ptr = local_2e8.sysDecimal.d.ptr;
  local_230.m_guide.sysDecimal.d.size = local_2e8.sysDecimal.d.size;
  if ((QArrayData *)local_230.m_guide.sysDecimal.d.d != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)local_230.m_guide.sysDecimal.d.d)->ref_)._q_value.super___atomic_base<int>._M_i
         = (((QArrayData *)local_230.m_guide.sysDecimal.d.d)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_230.m_guide.sysGroup.d.d = local_2e8.sysGroup.d.d;
  local_230.m_guide.sysGroup.d.ptr = local_2e8.sysGroup.d.ptr;
  local_230.m_guide.sysGroup.d.size = local_2e8.sysGroup.d.size;
  if (&(local_2e8.sysGroup.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2e8.sysGroup.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2e8.sysGroup.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         1;
    UNLOCK();
  }
  local_230.m_guide.sysMinus.d.d = local_2e8.sysMinus.d.d;
  local_230.m_guide.sysMinus.d.ptr = local_2e8.sysMinus.d.ptr;
  local_230.m_guide.sysMinus.d.size = local_2e8.sysMinus.d.size;
  if (&(local_2e8.sysMinus.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2e8.sysMinus.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2e8.sysMinus.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         1;
    UNLOCK();
  }
  local_230.m_guide.sysPlus.d.d = local_2e8.sysPlus.d.d;
  local_230.m_guide.sysPlus.d.ptr = local_2e8.sysPlus.d.ptr;
  local_230.m_guide.sysPlus.d.size = local_2e8.sysPlus.d.size;
  if (&(local_2e8.sysPlus.d.d)->super_QArrayData == (QArrayData *)0x0) {
    pQVar9 = (QArrayData *)0x0;
  }
  else {
    LOCK();
    ((local_2e8.sysPlus.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2e8.sysPlus.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1
    ;
    UNLOCK();
    pQVar9 = &(local_2e8.sysPlus.d.d)->super_QArrayData;
  }
  pQVar7 = &local_2e8.decimal;
  pQVar8 = &local_230.m_guide.decimal;
  for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
    pQVar8->m_size = pQVar7->m_size;
    pQVar7 = (QStringView *)&pQVar7[-(ulong)bVar13].m_data;
    pQVar8 = (QStringView *)&pQVar8[-(ulong)bVar13].m_data;
  }
  local_230.m_guide.zeroUcs = local_2e8.zeroUcs;
  local_230.m_index = 0;
  local_230.lastMark = '.' - (numMode == IntegerMode);
  local_230.m_mode = numMode;
  if (pQVar9 != (QArrayData *)0x0) {
    LOCK();
    (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar9->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_2e8.sysPlus.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_2e8.sysMinus.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2e8.sysMinus.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2e8.sysMinus.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2e8.sysMinus.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_2e8.sysMinus.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_2e8.sysGroup.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2e8.sysGroup.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2e8.sysGroup.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2e8.sysGroup.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_2e8.sysGroup.d.d)->super_QArrayData,2,0x10);
    }
  }
  piVar1 = (int *)CONCAT71(local_2e8.sysDecimal.d.d._1_7_,(byte)local_2e8.sysDecimal.d.d);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate
                ((QArrayData *)
                 CONCAT71(local_2e8.sysDecimal.d.d._1_7_,(byte)local_2e8.sysDecimal.d.d),2,0x10);
    }
  }
  SVar4 = Acceptable;
  if (local_230.m_index < local_230.m_text.m_size) {
    uVar6 = 0;
    uVar10 = 0;
    do {
      local_2e9 = anon_unknown.dwarf_c2e5d7::NumericTokenizer::nextToken(&local_230);
      uVar3 = (uint)local_2e9;
      cVar11 = (char)uVar10;
      if (9 < (int)(char)local_2e9 - 0x30U) {
        switch(uVar3) {
        case 0x2b:
        case 0x2d:
          if ((cVar11 == '\0') || (numMode == DoubleScientificMode && cVar11 == 'e'))
          goto LAB_00312aa8;
          break;
        case 0x2c:
          if ((((uint)number_options.super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
                      super_QFlagsStorage<QLocale::NumberOption>.i & 2) == 0 && uVar6 == 0) &&
             (uVar6 = 0, (int)cVar11 - 0x30U < 10)) goto LAB_00312b67;
          break;
        case 0x2e:
          if (numMode != IntegerMode) {
            uVar2 = 1;
            uVar10 = uVar6;
            goto joined_r0x00312b0a;
          }
          break;
        default:
          if (((uVar3 == 0x65) && (numMode == DoubleScientificMode)) &&
             (bVar12 = uVar6 != 2, uVar6 = 2, bVar12)) goto LAB_00312b10;
        }
LAB_00312bcd:
        __return_storage_ptr__->state = Invalid;
        (__return_storage_ptr__->buff).super_QVLABase<char>.super_QVLABaseBase.a = 0x100;
        (__return_storage_ptr__->buff).super_QVLABase<char>.super_QVLABaseBase.s = 0;
        (__return_storage_ptr__->buff).super_QVLABase<char>.super_QVLABaseBase.ptr =
             &(__return_storage_ptr__->buff).super_QVLAStorage<1UL,_1UL,_256LL>;
        goto LAB_00312bef;
      }
      if (uVar6 == 1) {
        uVar6 = 1;
        bVar12 = decDigits == 0;
        decDigits = decDigits + -1;
        if (bVar12) goto LAB_00312bcd;
      }
      else if ((uVar6 == 2) && (uVar6 = 2, local_2e9 == 0x30 && (int)cVar11 - 0x3aU < 0xfffffff6)) {
        uVar10 = (uint)number_options.super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
                       super_QFlagsStorage<QLocale::NumberOption>.i & 8;
        uVar2 = uVar6;
joined_r0x00312b0a:
        uVar6 = uVar2;
        if (uVar10 == 0) goto LAB_00312b10;
        goto LAB_00312bcd;
      }
LAB_00312aa8:
      if (local_2e9 != 0x2c) {
LAB_00312b10:
        if (local_150.super_QVLABase<char>.super_QVLABaseBase.s ==
            local_150.super_QVLABase<char>.super_QVLABaseBase.a) {
          local_2e8.sysDecimal.d.d._0_1_ = local_2e9;
          QVLABase<char>::emplace_back_impl<char>
                    (&local_150.super_QVLABase<char>,0x100,
                     &local_150.super_QVLAStorage<1UL,_1UL,_256LL>,(char *)&local_2e8);
        }
        else {
          QVLABase<char>::emplace_back_impl<char_const&>
                    (&local_150.super_QVLABase<char>,0x100,
                     &local_150.super_QVLAStorage<1UL,_1UL,_256LL>,(char *)&local_2e9);
        }
      }
LAB_00312b67:
      uVar10 = uVar3;
    } while (local_230.m_index < local_230.m_text.m_size);
    if (uVar3 - 0x2b < 0x3b) {
      SVar4 = Acceptable;
      if ((0x400000000000007U >> ((ulong)(uVar3 - 0x2b) & 0x3f) & 1) != 0) {
        SVar4 = Intermediate;
      }
    }
    else {
      SVar4 = Acceptable;
    }
  }
  __return_storage_ptr__->state = SVar4;
  local_158[0] = SVar4;
  QVarLengthArray<char,_256LL>::QVarLengthArray(&__return_storage_ptr__->buff,&local_150);
LAB_00312bef:
  if (&(local_230.m_guide.sysPlus.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_230.m_guide.sysPlus.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         = ((local_230.m_guide.sysPlus.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_230.m_guide.sysPlus.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate(&(local_230.m_guide.sysPlus.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_230.m_guide.sysMinus.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_230.m_guide.sysMinus.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         = ((local_230.m_guide.sysMinus.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_230.m_guide.sysMinus.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate(&(local_230.m_guide.sysMinus.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_230.m_guide.sysGroup.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_230.m_guide.sysGroup.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         = ((local_230.m_guide.sysGroup.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_230.m_guide.sysGroup.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate(&(local_230.m_guide.sysGroup.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_230.m_guide.sysDecimal.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_230.m_guide.sysDecimal.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
    _M_i = ((local_230.m_guide.sysDecimal.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_230.m_guide.sysDecimal.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_230.m_guide.sysDecimal.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QVLAStorage<1UL,_1UL,_256LL> *)local_150.super_QVLABase<char>.super_QVLABaseBase.ptr !=
      &local_150.super_QVLAStorage<1UL,_1UL,_256LL>) {
    QtPrivate::sizedFree
              (local_150.super_QVLABase<char>.super_QVLABaseBase.ptr,
               local_150.super_QVLABase<char>.super_QVLABaseBase.a);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

ParsingResult
QLocaleData::validateChars(QStringView str, NumberMode numMode, int decDigits,
                           QLocale::NumberOptions number_options) const
{
    ParsingResult result;
    result.buff.reserve(str.size());

    enum { Whole, Fractional, Exponent } state = Whole;
    const bool scientific = numMode == DoubleScientificMode;
    NumericTokenizer tokens(str, numericData(numMode), numMode);
    char last = '\0';

    while (!tokens.done()) {
        char c = tokens.nextToken();

        if (isAsciiDigit(c)) {
            switch (state) {
            case Whole:
                // Nothing special to do (unless we want to check grouping sizes).
                break;
            case Fractional:
                // If a double has too many digits in its fractional part it is Invalid.
                if (decDigits-- == 0)
                    return {};
                break;
            case Exponent:
                if (!isAsciiDigit(last)) {
                    // This is the first digit in the exponent (there may have beena '+'
                    // or '-' in before). If it's a zero, the exponent is zero-padded.
                    if (c == '0' && (number_options & QLocale::RejectLeadingZeroInExponent))
                        return {};
                }
                break;
            }

        } else {
            switch (c) {
            case '.':
                // If an integer has a decimal point, it is Invalid.
                // A double can only have one, at the end of its whole-number part.
                if (numMode == IntegerMode || state != Whole)
                    return {};
                // Even when decDigits is 0, we do allow the decimal point to be
                // present - just as long as no digits follow it.

                state = Fractional;
                break;

            case '+':
            case '-':
                // A sign can only appear at the start or after the e of scientific:
                if (last != '\0' && !(scientific && last == 'e'))
                    return {};
                break;

            case ',':
                // Grouping is only allowed after a digit in the whole-number portion:
                if ((number_options & QLocale::RejectGroupSeparator) || state != Whole
                        || !isAsciiDigit(last)) {
                    return {};
                }
                // We could check grouping sizes are correct, but fixup()s are
                // probably better off correcting any misplacement instead.
                break;

            case 'e':
                // Only one e is allowed and only in scientific:
                if (!scientific || state == Exponent)
                    return {};
                state = Exponent;
                break;

            default:
                // Nothing else can validly appear in a number.
                // NumericTokenizer allows letters of "inf" and "nan", but
                // validators don't accept those values.
                // For anything else, tokens.nextToken() must have returned 0.
                Q_ASSERT(!c || c == 'a' || c == 'f' || c == 'i' || c == 'n');
                return {};
            }
        }

        last = c;
        if (c != ',') // Skip grouping
            result.buff.append(c);
    }

    result.state = ParsingResult::Acceptable;

    // Intermediate if it ends with any character that requires a digit after
    // it to be valid e.g. group separator, sign, or exponent
    if (last == ',' || last == '-' || last == '+' || last == 'e')
        result.state = ParsingResult::Intermediate;

    return result;
}